

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cpp
# Opt level: O0

void sqlcheck::CheckIndexCount(Configuration *state,string *sql_statement,bool *print_statement)

{
  char *pcVar1;
  bool bVar2;
  allocator local_d1;
  string local_d0;
  string local_b0;
  char *local_90;
  char *message;
  PatternType pattern_type;
  allocator local_71;
  string local_70 [8];
  string title;
  regex pattern;
  size_t min_count;
  bool create_statement;
  bool *print_statement_local;
  string *sql_statement_local;
  Configuration *state_local;
  
  bVar2 = IsCreateStatement(sql_statement);
  if (bVar2) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)((long)&title.field_2 + 8),
               "(index)",0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"Too Many Indexes",&local_71);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    message._0_4_ = 1;
    local_90 = anon_var_dwarf_5a821;
    std::__cxx11::string::string((string *)&local_b0,local_70);
    pcVar1 = local_90;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_d0,pcVar1,&local_d1);
    CheckPattern(state,sql_statement,print_statement,(regex *)((long)&title.field_2 + 8),
                 RISK_LEVEL_MEDIUM,PATTERN_TYPE_PHYSICAL_DATABASE_DESIGN,&local_b0,&local_d0,true,3)
    ;
    std::__cxx11::string::~string((string *)&local_d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_d1);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string(local_70);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)((long)&title.field_2 + 8));
  }
  return;
}

Assistant:

void CheckIndexCount(Configuration& state,
                     const std::string& sql_statement,
                     bool& print_statement){

  auto create_statement = IsCreateStatement(sql_statement);
  if(create_statement == false){
    return;
  }

  std::size_t min_count = 3;
  std::regex pattern("(index)");
  std::string title = "Too Many Indexes";
  PatternType pattern_type = PatternType::PATTERN_TYPE_PHYSICAL_DATABASE_DESIGN;

  auto message =
      "● Don't create too many indexes:  "
      "You benefit from an index only if you run queries that use that index. "
      "There's no benefit to creating indexes that you don't use. "
      "If you cover a database table with indexes, you incur a lot of overhead "
      "with no assurance of payoff. "
      "Consider dropping unnecessary indexes. "
      "If an index provides all the columns we need, then we don't need to read "
      "rows of data from the table at all. Consider using such covering indexes. "
      "Know your data, know your queries, and maintain the right set of indexes.";

  CheckPattern(state,
               sql_statement,
               print_statement,
               pattern,
               RISK_LEVEL_MEDIUM,
               pattern_type,
               title,
               message,
               true,
               min_count);

}